

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::big_decimal_fp,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,big_decimal_fp *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  ulong uVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int num_zeros;
  sign_t sign;
  int significand_size;
  anon_class_40_7_ef14d3db write;
  char *significand;
  int exp;
  undefined1 local_7d [5];
  big_decimal_fp local_78;
  anon_class_56_7_a2a26a24 local_68;
  char *******local_30;
  int local_24;
  
  local_30 = (char *******)fp->significand;
  local_78.exponent = fp->significand_size;
  local_78.significand._4_4_ = fspecs._4_4_;
  local_78.significand_size = local_78.significand._4_4_ >> 8 & 0xff;
  local_7d[0] = decimal_point;
  local_78.significand = (char *)fspecs;
  if (local_78.exponent < 0) goto LAB_0049b158;
  uVar8 = (ulong)((local_78.exponent + 1) - (uint)(local_78.significand_size == 0));
  uVar7 = fp->exponent;
  iVar6 = uVar7 + local_78.exponent;
  local_78.significand._0_4_ = fspecs.precision;
  if (fspecs._4_1_ != '\x01') {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar9 = 0x10;
      if (0 < (int)(uint)local_78.significand) {
        uVar9 = (uint)local_78.significand;
      }
      if ((iVar6 < -3) || ((int)uVar9 < iVar6)) goto LAB_0049aed8;
    }
    local_24 = iVar6;
    if ((int)uVar7 < 0) {
      if (iVar6 < 1) {
        uVar7 = -iVar6;
        local_7d._1_4_ = uVar7;
        if (SBORROW4((uint)local_78.significand,uVar7) !=
            (int)((uint)local_78.significand + iVar6) < 0) {
          local_7d._1_4_ = (uint)local_78.significand;
        }
        if ((int)(uint)local_78.significand < 0) {
          local_7d._1_4_ = uVar7;
        }
        if (local_78.exponent != 0) {
          local_7d._1_4_ = uVar7;
        }
        if (-1 < (int)local_7d._1_4_) {
          local_68.sign = (sign_t *)&local_78.significand_size;
          local_68.significand = (char **)(local_7d + 1);
          local_68.significand_size = &local_78.exponent;
          local_68.fp = (big_decimal_fp *)(local_7d + 5);
          local_68.fspecs = (float_specs *)local_7d;
          local_68.decimal_point = (char *)&local_30;
          uVar1 = (ulong)specs->width;
          if (-1 < (long)uVar1) {
            uVar8 = (uint)local_7d._1_4_ + uVar8 + 2;
            uVar5 = 0;
            if (uVar8 <= uVar1) {
              uVar5 = uVar1 - uVar8;
            }
            uVar8 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                       (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
            bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                              (out,uVar8,&specs->fill);
            bVar2.container =
                 (buffer<char> *)
                 write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
                 ::anon_class_48_6_9afe1116::operator()
                           ((anon_class_48_6_9afe1116 *)&local_68,bVar2.container);
            goto LAB_0049b13c;
          }
        }
      }
      else {
        local_7d._1_4_ =
             (uint)local_78.significand - local_78.exponent &
             (int)(local_78.significand._4_4_ << 0xb) >> 0x1f;
        local_68.decimal_point = local_7d + 1;
        local_68.sign = (sign_t *)&local_78.significand_size;
        local_68.significand = (char **)&local_30;
        local_68.significand_size = &local_78.exponent;
        local_68.fp = (big_decimal_fp *)&local_24;
        local_68.fspecs = (float_specs *)local_7d;
        uVar1 = (ulong)specs->width;
        if (-1 < (long)uVar1) {
          uVar5 = (ulong)(uint)local_7d._1_4_;
          if ((int)local_7d._1_4_ < 1) {
            uVar5 = 0;
          }
          uVar8 = uVar5 + uVar8 + 1;
          uVar5 = 0;
          if (uVar8 <= uVar1) {
            uVar5 = uVar1 - uVar8;
          }
          uVar8 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                     (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
          bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                            (out,uVar8,&specs->fill);
          bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
                  ::anon_class_48_6_48d028d1::operator()
                            ((anon_class_48_6_48d028d1 *)&local_68,bVar2.container);
          goto LAB_0049b13c;
        }
      }
    }
    else {
      uVar8 = uVar7 + uVar8;
      local_7d._1_4_ = (uint)local_78.significand - iVar6;
      if ((local_78.significand._4_4_ >> 0x14 & 1) != 0) {
        if (fspecs._4_1_ != '\x02' && (int)local_7d._1_4_ < 1) {
          local_7d._1_4_ = 1;
        }
        if (0 < (long)(int)local_7d._1_4_) {
          uVar8 = uVar8 + (long)(int)local_7d._1_4_;
        }
      }
      local_68.sign = (sign_t *)&local_78.significand_size;
      local_68.significand = (char **)&local_30;
      local_68.significand_size = &local_78.exponent;
      local_68.fspecs = (float_specs *)(local_7d + 5);
      local_68.decimal_point = local_7d;
      local_68.num_zeros = (int *)(local_7d + 1);
      uVar1 = (ulong)specs->width;
      local_68.fp = fp;
      if (-1 < (long)uVar1) {
        uVar5 = 0;
        if (uVar8 <= uVar1) {
          uVar5 = uVar1 - uVar8;
        }
        uVar8 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                          (out,uVar8,&specs->fill);
        bVar2.container =
             (buffer<char> *)
             write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
             ::anon_class_56_7_a2a26a24::operator()(&local_68,bVar2.container);
        goto LAB_0049b13c;
      }
    }
LAB_0049b158:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                ,0x146,"negative value");
  }
LAB_0049aed8:
  iVar3 = uVar7 + local_78.exponent + -1;
  if ((local_78.significand._4_4_ >> 0x14 & 1) == 0) {
    uVar1 = 0;
    if (local_78.exponent == 1) {
      local_7d[0] = '\0';
    }
  }
  else {
    uVar1 = 0;
    if (0 < (int)((uint)local_78.significand - local_78.exponent)) {
      uVar1 = (ulong)((uint)local_78.significand - local_78.exponent);
    }
    uVar8 = uVar8 + uVar1;
  }
  local_68.sign =
       (sign_t *)
       (CONCAT44(local_68.sign._4_4_,local_78.significand._4_4_ >> 8) & 0xffffffff000000ff);
  local_68.significand_size._0_5_ = CONCAT14(local_7d[0],local_78.exponent);
  local_68.fp = (big_decimal_fp *)
                (CONCAT35(local_68.fp._5_3_,
                          CONCAT14(((local_78.significand._4_4_ >> 0x10 & 1) == 0) << 5,(int)uVar1))
                | 0x4500000000);
  local_68.fspecs = (float_specs *)CONCAT44(local_68.fspecs._4_4_,iVar3);
  uVar1 = (ulong)specs->width;
  local_68.significand = (char **)local_30;
  if ((long)uVar1 < 1) {
    bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
            ::anon_class_40_7_ef14d3db::operator()
                      ((anon_class_40_7_ef14d3db *)&local_68,out.container);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
  }
  if (iVar6 < 1) {
    iVar3 = 1 - iVar6;
  }
  lVar4 = 2;
  if (99 < iVar3) {
    lVar4 = (ulong)(999 < iVar3) + 3;
  }
  uVar8 = uVar8 + (3 - (ulong)(local_7d[0] == '\0')) + lVar4;
  uVar5 = 0;
  if (uVar8 <= uVar1) {
    uVar5 = uVar1 - uVar8;
  }
  uVar8 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                             (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (out,uVar8,&specs->fill);
  bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::big_decimal_fp,_char>
          ::anon_class_40_7_ef14d3db::operator()
                    ((anon_class_40_7_ef14d3db *)&local_68,bVar2.container);
LAB_0049b13c:
  bVar2 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                    (bVar2,uVar5 - uVar8,&specs->fill);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar2.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}